

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O2

int evmap_signal_reinit_iter_fn(event_base *base,int signum,evmap_signal *ctx,void *arg)

{
  int iVar1;
  int *result;
  
  if (((ctx->events).lh_first != (event *)0x0) &&
     (iVar1 = (*base->evsigsel->add)(base,signum,0,8,(void *)0x0), iVar1 == -1)) {
    *(undefined4 *)arg = 0xffffffff;
  }
  return 0;
}

Assistant:

static int
evmap_signal_reinit_iter_fn(struct event_base *base,
    int signum, struct evmap_signal *ctx, void *arg)
{
	const struct eventop *evsel = base->evsigsel;
	int *result = arg;

	if (!LIST_EMPTY(&ctx->events)) {
		if (evsel->add(base, signum, 0, EV_SIGNAL, NULL) == -1)
			*result = -1;
	}
	return 0;
}